

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linetype.cpp
# Opt level: O3

bool __thiscall ON_Linetype::SetTaper(ON_Linetype *this,double startWidth,double endWidth)

{
  ON_LinetypePrivate *pOVar1;
  ON_2dPoint *__s;
  ON_LinetypePrivate *pOVar2;
  bool bVar3;
  ON_2dPoint local_30;
  
  bVar3 = 0.0 <= startWidth && 0.0 <= endWidth;
  if (bVar3) {
    pOVar1 = this->m_private;
    __s = (pOVar1->m_taper_points).m_a;
    pOVar2 = pOVar1;
    if (__s != (ON_2dPoint *)0x0) {
      memset(__s,0,(long)(pOVar1->m_taper_points).m_capacity << 4);
      pOVar2 = this->m_private;
    }
    (pOVar1->m_taper_points).m_count = 0;
    ON_2dPoint::ON_2dPoint(&local_30,0.0,startWidth);
    ON_SimpleArray<ON_2dPoint>::Append(&pOVar2->m_taper_points,&local_30);
    pOVar1 = this->m_private;
    ON_2dPoint::ON_2dPoint(&local_30,1.0,endWidth);
    ON_SimpleArray<ON_2dPoint>::Append(&pOVar1->m_taper_points,&local_30);
  }
  return bVar3;
}

Assistant:

bool ON_Linetype::SetTaper(double startWidth, double endWidth)
{
  if (startWidth < 0 || endWidth < 0)
    return false;

  m_private->m_taper_points.Empty();
  m_private->m_taper_points.Append(ON_2dPoint(0, startWidth));
  m_private->m_taper_points.Append(ON_2dPoint(1.0, endWidth));
  return true;
}